

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

ParameterError file2string(char **bufp,FILE *file)

{
  CURLcode CVar1;
  ParameterError PVar2;
  char *pcVar3;
  dynbuf dyn;
  char buffer [256];
  dynbuf dStack_148;
  char local_128 [264];
  
  curlx_dyn_init(&dStack_148,0x10000000);
  if (file == (FILE *)0x0) {
LAB_00119557:
    pcVar3 = curlx_dyn_ptr(&dStack_148);
    *bufp = pcVar3;
    PVar2 = PARAM_OK;
  }
  else {
    do {
      pcVar3 = fgets(local_128,0x100,(FILE *)file);
      if (pcVar3 == (char *)0x0) goto LAB_00119557;
      pcVar3 = strchr(local_128,0xd);
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
      }
      pcVar3 = strchr(local_128,10);
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
      }
      CVar1 = curlx_dyn_add(&dStack_148,local_128);
    } while (CVar1 == CURLE_OK);
    PVar2 = PARAM_NO_MEM;
  }
  return PVar2;
}

Assistant:

ParameterError file2string(char **bufp, FILE *file)
{
  struct curlx_dynbuf dyn;
  curlx_dyn_init(&dyn, MAX_FILE2STRING);
  if(file) {
    char buffer[256];

    while(fgets(buffer, sizeof(buffer), file)) {
      char *ptr = strchr(buffer, '\r');
      if(ptr)
        *ptr = '\0';
      ptr = strchr(buffer, '\n');
      if(ptr)
        *ptr = '\0';
      if(curlx_dyn_add(&dyn, buffer))
        return PARAM_NO_MEM;
    }
  }
  *bufp = curlx_dyn_ptr(&dyn);
  return PARAM_OK;
}